

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void finish_paybill(void)

{
  obj *otmp;
  uint uVar1;
  int x;
  int y;
  
  x = (int)repo_location_0;
  y = (int)repo_location_1;
  unwield_weapons_silently();
  unleash_all();
  otmp = invent;
  while (otmp != (obj *)0x0) {
    invent = otmp;
    otmp->owornmask = 0;
    otmp->field_0x4c = otmp->field_0x4c & 0xf7;
    uVar1 = mt_random();
    if (0x33333333 < uVar1 * -0x33333333) {
      curse(otmp);
    }
    obj_extract_self(otmp);
    place_object(otmp,level,x,y);
    otmp = invent;
  }
  invent = otmp;
  return;
}

Assistant:

void finish_paybill(void)
{
	struct obj *otmp;
	int ox = repo_location.x,
	    oy = repo_location.y;

	/* If twoweaponing and the swap weapon gets cursed, it slips to the
	 * ground and we get a warning message. */
	unwield_weapons_silently();

	/* normally done by savebones(), but that's too late in this case */
	unleash_all();
	/* transfer all of the character's inventory to the shop floor */
	while ((otmp = invent) != 0) {
	    otmp->owornmask = 0L;	/* perhaps we should call setnotworn? */
	    otmp->lamplit = 0;		/* avoid "goes out" msg from freeinv */
	    if (rn2(5)) curse(otmp);	/* normal bones treatment for invent */
	    obj_extract_self(otmp);
	    place_object(otmp, level, ox, oy);
	}
}